

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::HasProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl,
          PropertyValueInfo *info)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *this_00;
  ScriptContext *scriptContext;
  PropertyIndex propertyIndex;
  PropertyValueInfo *pPStack_38;
  uint32 indexVal;
  PropertyValueInfo *info_local;
  bool *noRedecl_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  pPStack_38 = info;
  info_local = (PropertyValueInfo *)noRedecl;
  noRedecl_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  scriptContext._2_2_ = GetPropertyIndex(this,propertyId);
  if (scriptContext._2_2_ == 0xffff) {
    this_00 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
    bVar1 = DynamicObject::HasObjectArray(pDStack_20);
    if ((bVar1) &&
       (BVar2 = ScriptContext::IsNumericPropertyId
                          (this_00,noRedecl_local._4_4_,(uint32 *)((long)&scriptContext + 4)),
       BVar2 != 0)) {
      this_local._4_4_ =
           DynamicTypeHandler::HasItem
                     (&this->super_DynamicTypeHandler,pDStack_20,scriptContext._4_4_);
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    if (pPStack_38 != (PropertyValueInfo *)0x0) {
      SetPropertyValueInfo
                (this,pPStack_38,&pDStack_20->super_RecyclableObject,scriptContext._2_2_,
                 ObjectSlotAttr_Writable);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        uint32 indexVal;
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        PropertyIndex propertyIndex = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        if (propertyIndex != Constants::NoSlot)
        {
            if (info)
            {
                this->SetPropertyValueInfo(info, instance, propertyIndex);
            }
            return true;
        }

        // Check numeric propertyId only if objectArray is available
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return PathTypeHandlerBase::HasItem(instance, indexVal);
        }

        return false;
    }